

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O1

DWARFDie __thiscall llvm::DWARFUnit::getSubroutineForAddress(DWARFUnit *this,uint64_t Address)

{
  DWARFUnit *pDVar1;
  _Base_ptr p_Var2;
  long lVar3;
  DWARFUnit *pDVar4;
  DWARFDebugInfoEntry *pDVar5;
  _Rb_tree_node_base *p_Var6;
  DWARFDie DVar7;
  DWARFDie Die;
  
  extractDIEsIfNeeded(this,false);
  if ((this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    extractDIEsIfNeeded(this,true);
    pDVar4 = (DWARFUnit *)
             (this->DieArray).
             super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pDVar1 = this;
    if (pDVar4 == (DWARFUnit *)
                  (this->DieArray).
                  super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      pDVar4 = (DWARFUnit *)0x0;
      pDVar1 = (DWARFUnit *)0x0;
    }
    Die.Die = (DWARFDebugInfoEntry *)pDVar4;
    Die.U = pDVar1;
    updateAddressDieMap(this,Die);
  }
  p_Var6 = &(this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var2 = (this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) <= Address]) {
    if (Address < *(ulong *)(p_Var2 + 1)) {
      p_Var6 = p_Var2;
    }
  }
  if ((p_Var6 == (this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) ||
     (lVar3 = std::_Rb_tree_decrement(p_Var6), *(ulong *)(lVar3 + 0x28) <= Address)) {
    pDVar5 = (DWARFDebugInfoEntry *)0x0;
    pDVar4 = (DWARFUnit *)0x0;
  }
  else {
    pDVar4 = *(DWARFUnit **)(lVar3 + 0x30);
    pDVar5 = *(DWARFDebugInfoEntry **)(lVar3 + 0x38);
  }
  DVar7.Die = pDVar5;
  DVar7.U = pDVar4;
  return DVar7;
}

Assistant:

DWARFDie DWARFUnit::getSubroutineForAddress(uint64_t Address) {
  extractDIEsIfNeeded(false);
  if (AddrDieMap.empty())
    updateAddressDieMap(getUnitDIE());
  auto R = AddrDieMap.upper_bound(Address);
  if (R == AddrDieMap.begin())
    return DWARFDie();
  // upper_bound's previous item contains Address.
  --R;
  if (Address >= R->second.first)
    return DWARFDie();
  return R->second.second;
}